

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  PingClient client;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  PingServer local_c8;
  
  if (argc < 3) {
    if (argc != 2) {
      PingServer::PingServer(&local_c8);
      Dashel::Hub::run();
      PingServer::~PingServer(&local_c8);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,argv[1],&local_109);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"default message, the other side does lack creativity",
               &local_10a);
    PingClient::PingClient((PingClient *)&local_c8,&local_e8,&local_108);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,argv[1],&local_109);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[2],&local_10a);
    PingClient::PingClient((PingClient *)&local_c8,&local_e8,&local_108);
  }
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  Dashel::Hub::~Hub(&local_c8.super_Hub);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			PingClient client(argv[1], argv[2]);
		}
		else if (argc > 1)
		{
			PingClient client(argv[1], "default message, the other side does lack creativity");
		}
		else
		{
			PingServer().run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}